

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

ValueType * __thiscall
huelang::WordValue::getType(ValueType *__return_storage_ptr__,WordValue *this,Environment *env)

{
  Word WVar1;
  allocator<char> aStack_18049;
  string sStack_18048;
  unsigned_short uStack_18028;
  undefined6 uStack_18026;
  Word wordword;
  DefinitionTable table;
  Environment *env_local;
  WordValue *this_local;
  
  DefinitionTable::DefinitionTable((DefinitionTable *)&wordword.minor,&env->definitionTable);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_18048,"word",&aStack_18049);
  WVar1 = DefinitionTable::TokToWord((DefinitionTable *)&wordword.minor,&sStack_18048);
  wordword._0_8_ = WVar1.minor;
  uStack_18028 = WVar1.major;
  std::__cxx11::string::~string((string *)&sStack_18048);
  std::allocator<char>::~allocator(&aStack_18049);
  __return_storage_ptr__->compound =
       (vector<huelang::ValueType,_std::allocator<huelang::ValueType>_> *)0x0;
  *(ulong *)&__return_storage_ptr__->atom = CONCAT62(uStack_18026,uStack_18028);
  (__return_storage_ptr__->atom).minor = wordword._0_8_;
  __return_storage_ptr__->isCompound = false;
  DefinitionTable::~DefinitionTable((DefinitionTable *)&wordword.minor);
  return __return_storage_ptr__;
}

Assistant:

ValueType WordValue::getType(Environment& env) {
        DefinitionTable table = env.definitionTable;
        Word wordword = table.TokToWord(WORDWORD);
        return ValueType{NULL, wordword, false};
    }